

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O0

uint tinf_crc32(void *data,uint length)

{
  uint uVar1;
  uint local_30;
  uint local_2c;
  uint i;
  uint crc;
  uchar *buf;
  uint length_local;
  void *data_local;
  
  local_2c = 0xffffffff;
  if (length == 0) {
    data_local._4_4_ = 0;
  }
  else {
    for (local_30 = 0; local_30 < length; local_30 = local_30 + 1) {
      local_2c = *(byte *)((long)data + (ulong)local_30) ^ local_2c;
      uVar1 = tinf_crc32tab[local_2c & 0xf] ^ local_2c >> 4;
      local_2c = tinf_crc32tab[uVar1 & 0xf] ^ uVar1 >> 4;
    }
    data_local._4_4_ = local_2c ^ 0xffffffff;
  }
  return data_local._4_4_;
}

Assistant:

unsigned int tinf_crc32(const void *data, unsigned int length)
{
	const unsigned char *buf = (const unsigned char *) data;
	unsigned int crc = 0xFFFFFFFF;
	unsigned int i;

	if (length == 0) {
		return 0;
	}

	for (i = 0; i < length; ++i) {
		crc ^= buf[i];
		crc = tinf_crc32tab[crc & 0x0F] ^ (crc >> 4);
		crc = tinf_crc32tab[crc & 0x0F] ^ (crc >> 4);
	}

	return crc ^ 0xFFFFFFFF;
}